

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Add_constant_patch64(int g_a,int64_t *lo,int64_t *hi,void *alpha)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int i_1;
  int i;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer a;
  Integer in_stack_00000140;
  void *in_stack_ffffffffffffff48;
  int iVar1;
  int iVar2;
  Integer *in_stack_ffffffffffffff58;
  Integer in_stack_ffffffffffffff60;
  long local_68 [7];
  long local_30;
  long local_28;
  long local_18;
  long local_10;
  
  local_28 = (long)in_EDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = pnga_ndim(in_stack_00000140);
  for (iVar2 = 0; iVar2 < local_30; iVar2 = iVar2 + 1) {
    local_68[(local_30 - iVar2) + -1] = *(long *)(local_10 + (long)iVar2 * 8) + 1;
  }
  for (iVar1 = 0; iVar1 < local_30; iVar1 = iVar1 + 1) {
    *(long *)(&stack0xffffffffffffff58 + ((local_30 - iVar1) + -1) * 8) =
         *(long *)(local_18 + (long)iVar1 * 8) + 1;
  }
  pnga_add_constant_patch
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(Integer *)CONCAT44(iVar2,iVar1),
             in_stack_ffffffffffffff48);
  return;
}

Assistant:

void GA_Add_constant_patch64(int g_a, int64_t *lo, int64_t *hi, void *alpha)
{
    Integer a = (Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    wnga_add_constant_patch(a, _ga_lo, _ga_hi, alpha);
}